

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  char *pcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string sStack_118;
  string local_pname;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (name->_M_string_length < 3) {
    if ((name->_M_string_length != 2) || (*(name->_M_dataplus)._M_p != '-')) goto LAB_0011d4a6;
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    if (*pcVar1 != '-') {
LAB_0011d4a6:
      ::std::__cxx11::string::string((string *)&local_pname,(string *)&this->pname_);
      if ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true) {
        ::std::__cxx11::string::string((string *)&local_78,(string *)&local_pname);
        detail::remove_underscore(&sStack_118,&local_78);
        ::std::__cxx11::string::operator=((string *)&local_pname,(string *)&sStack_118);
        ::std::__cxx11::string::~string((string *)&sStack_118);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::__cxx11::string::string((string *)&local_98,(string *)name);
        detail::remove_underscore(&sStack_118,&local_98);
        ::std::__cxx11::string::operator=((string *)name,(string *)&sStack_118);
        ::std::__cxx11::string::~string((string *)&sStack_118);
        ::std::__cxx11::string::~string((string *)&local_98);
      }
      if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
        ::std::__cxx11::string::string((string *)&local_b8,(string *)&local_pname);
        detail::to_lower(&sStack_118,&local_b8);
        ::std::__cxx11::string::operator=((string *)&local_pname,(string *)&sStack_118);
        ::std::__cxx11::string::~string((string *)&sStack_118);
        ::std::__cxx11::string::~string((string *)&local_b8);
        ::std::__cxx11::string::string((string *)&local_d8,(string *)name);
        detail::to_lower(&sStack_118,&local_d8);
        ::std::__cxx11::string::operator=((string *)name,(string *)&sStack_118);
        ::std::__cxx11::string::~string((string *)&sStack_118);
        ::std::__cxx11::string::~string((string *)&local_d8);
      }
      __rhs = &local_pname;
      bVar2 = ::std::operator==(name,__rhs);
      goto LAB_0011d5e0;
    }
    if (pcVar1[1] == '-') {
      ::std::__cxx11::string::substr((ulong)&local_38,(ulong)name);
      bVar2 = check_lname(this,&local_38);
      __rhs = &local_38;
      goto LAB_0011d5e0;
    }
  }
  ::std::__cxx11::string::substr((ulong)&local_58,(ulong)name);
  bVar2 = check_sname(this,&local_58);
  __rhs = &local_58;
LAB_0011d5e0:
  ::std::__cxx11::string::~string((string *)__rhs);
  return bVar2;
}

Assistant:

bool check_name(std::string name) const {

        if(name.length() > 2 && name[0] == '-' && name[1] == '-')
            return check_lname(name.substr(2));
        if(name.length() > 1 && name.front() == '-')
            return check_sname(name.substr(1));

        std::string local_pname = pname_;
        if(ignore_underscore_) {
            local_pname = detail::remove_underscore(local_pname);
            name = detail::remove_underscore(name);
        }
        if(ignore_case_) {
            local_pname = detail::to_lower(local_pname);
            name = detail::to_lower(name);
        }
        return name == local_pname;
    }